

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O0

bool __thiscall
glsl_type::can_implicitly_convert_to
          (glsl_type *this,glsl_type *desired,_mesa_glsl_parse_state *state)

{
  bool bVar1;
  _mesa_glsl_parse_state *state_local;
  glsl_type *desired_local;
  glsl_type *this_local;
  
  if (this == desired) {
    this_local._7_1_ = true;
  }
  else if ((state == (_mesa_glsl_parse_state *)0x0) ||
          (bVar1 = _mesa_glsl_parse_state::has_implicit_conversions(state), bVar1)) {
    if ((this->matrix_columns < 2) && (desired->matrix_columns < 2)) {
      if (this->vector_elements == desired->vector_elements) {
        bVar1 = is_float(desired);
        if ((bVar1) && (bVar1 = is_integer_32(this), bVar1)) {
          this_local._7_1_ = true;
        }
        else if (((state == (_mesa_glsl_parse_state *)0x0) ||
                 (bVar1 = _mesa_glsl_parse_state::has_implicit_uint_to_int_conversion(state), bVar1)
                 ) && (((*(uint *)&desired->field_0x4 & 0xff) == 0 &&
                       ((*(uint *)&this->field_0x4 & 0xff) == 1)))) {
          this_local._7_1_ = true;
        }
        else if (((state == (_mesa_glsl_parse_state *)0x0) ||
                 (bVar1 = _mesa_glsl_parse_state::has_double(state), bVar1)) &&
                (bVar1 = is_double(this), bVar1)) {
          this_local._7_1_ = false;
        }
        else {
          if (((state == (_mesa_glsl_parse_state *)0x0) ||
              (bVar1 = _mesa_glsl_parse_state::has_double(state), bVar1)) &&
             (bVar1 = is_double(desired), bVar1)) {
            bVar1 = is_float(this);
            if (bVar1) {
              return true;
            }
            bVar1 = is_integer_32(this);
            if (bVar1) {
              return true;
            }
          }
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
glsl_type::can_implicitly_convert_to(const glsl_type *desired,
                                     _mesa_glsl_parse_state *state) const
{
   if (this == desired)
      return true;

   /* GLSL 1.10 and ESSL do not allow implicit conversions. If there is no
    * state, we're doing intra-stage function linking where these checks have
    * already been done.
    */
   if (state && !state->has_implicit_conversions())
      return false;

   /* There is no conversion among matrix types. */
   if (this->matrix_columns > 1 || desired->matrix_columns > 1)
      return false;

   /* Vector size must match. */
   if (this->vector_elements != desired->vector_elements)
      return false;

   /* int and uint can be converted to float. */
   if (desired->is_float() && this->is_integer_32())
      return true;

   /* With GLSL 4.0, ARB_gpu_shader5, or MESA_shader_integer_functions, int
    * can be converted to uint.  Note that state may be NULL here, when
    * resolving function calls in the linker. By this time, all the
    * state-dependent checks have already happened though, so allow anything
    * that's allowed in any shader version.
    */
   if ((!state || state->has_implicit_uint_to_int_conversion()) &&
         desired->base_type == GLSL_TYPE_UINT && this->base_type == GLSL_TYPE_INT)
      return true;

   /* No implicit conversions from double. */
   if ((!state || state->has_double()) && this->is_double())
      return false;

   /* Conversions from different types to double. */
   if ((!state || state->has_double()) && desired->is_double()) {
      if (this->is_float())
         return true;
      if (this->is_integer_32())
         return true;
   }

   return false;
}